

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O0

bool anon_unknown.dwarf_4f80d7::ArchToolsetStrategyHelper
               (optional<cmCMakePresetsGraph::ArchToolsetStrategy> *out,Value *value,
               cmJSONState *state)

{
  bool bVar1;
  ArchToolsetStrategy local_94;
  ValueHolder local_90;
  String local_88;
  ArchToolsetStrategy local_68;
  ValueHolder local_64 [2];
  String local_50;
  cmJSONState *local_28;
  cmJSONState *state_local;
  Value *value_local;
  optional<cmCMakePresetsGraph::ArchToolsetStrategy> *out_local;
  
  local_28 = state;
  state_local = (cmJSONState *)value;
  value_local = (Value *)out;
  if (value == (Value *)0x0) {
    std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>::operator=(out);
    out_local._7_1_ = true;
  }
  else {
    bVar1 = Json::Value::isString(value);
    if (bVar1) {
      Json::Value::asString_abi_cxx11_(&local_50,(Value *)state_local);
      bVar1 = std::operator==(&local_50,"set");
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) {
        local_68 = Set;
        std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>::
        optional<cmCMakePresetsGraph::ArchToolsetStrategy,_true>
                  ((optional<cmCMakePresetsGraph::ArchToolsetStrategy> *)local_64,&local_68);
        value_local->value_ = local_64[0];
        out_local._7_1_ = true;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_88,(Value *)state_local);
        bVar1 = std::operator==(&local_88,"external");
        std::__cxx11::string::~string((string *)&local_88);
        if (bVar1) {
          local_94 = External;
          std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>::
          optional<cmCMakePresetsGraph::ArchToolsetStrategy,_true>
                    ((optional<cmCMakePresetsGraph::ArchToolsetStrategy> *)&local_90,&local_94);
          value_local->value_ = local_90;
          out_local._7_1_ = true;
        }
        else {
          cmCMakePresetsErrors::INVALID_PRESET((Value *)state_local,local_28);
          out_local._7_1_ = false;
        }
      }
    }
    else {
      cmCMakePresetsErrors::INVALID_PRESET((Value *)state_local,local_28);
      out_local._7_1_ = false;
    }
  }
  return out_local._7_1_;
}

Assistant:

bool ArchToolsetStrategyHelper(cm::optional<ArchToolsetStrategy>& out,
                               const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    out = cm::nullopt;
    return true;
  }

  if (!value->isString()) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (value->asString() == "set") {
    out = ArchToolsetStrategy::Set;
    return true;
  }

  if (value->asString() == "external") {
    out = ArchToolsetStrategy::External;
    return true;
  }

  cmCMakePresetsErrors::INVALID_PRESET(value, state);
  return false;
}